

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Reader * __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::getParams
          (Reader *__return_storage_ptr__,MembraneCallContextHook *this)

{
  anon_union_32_1_a8c68091_for_NullableValue<capnp::AnyPointer::Reader>_2 *paVar1;
  SegmentReader *pSVar2;
  CapTableReader *pCVar3;
  PointerReader reader;
  int iVar4;
  undefined4 uVar5;
  Reader *p;
  DebugExpression<bool> _kjCondition;
  Fault f;
  DebugExpression<bool> local_51;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_51.value = (bool)(this->releasedParams ^ 1);
  if (this->releasedParams == false) {
    paVar1 = &(this->params).ptr.field_1;
    if ((this->params).ptr.isSet == true) {
      pSVar2 = (paVar1->value).reader.segment;
      pCVar3 = (this->params).ptr.field_1.value.reader.capTable;
      iVar4 = *(int *)((long)&(this->params).ptr.field_1 + 0x18);
      uVar5 = *(undefined4 *)((long)&(this->params).ptr.field_1 + 0x1c);
      (__return_storage_ptr__->reader).pointer = (this->params).ptr.field_1.value.reader.pointer;
      (__return_storage_ptr__->reader).nestingLimit = iVar4;
      *(undefined4 *)&(__return_storage_ptr__->reader).field_0x1c = uVar5;
      (__return_storage_ptr__->reader).segment = pSVar2;
      (__return_storage_ptr__->reader).capTable = pCVar3;
    }
    else {
      (**((this->inner).ptr)->_vptr_CallContextHook)(&local_48);
      reader.capTable = (CapTableReader *)uStack_40;
      reader.segment = (SegmentReader *)local_48;
      reader.pointer = (WirePointer *)local_38;
      reader._24_8_ = uStack_30;
      MembraneCapTableReader::imbue(&__return_storage_ptr__->reader,&this->paramsCapTable,reader);
      if ((this->params).ptr.isSet == true) {
        (this->params).ptr.isSet = false;
      }
      pSVar2 = (__return_storage_ptr__->reader).segment;
      pCVar3 = (__return_storage_ptr__->reader).capTable;
      iVar4 = (__return_storage_ptr__->reader).nestingLimit;
      uVar5 = *(undefined4 *)&(__return_storage_ptr__->reader).field_0x1c;
      (this->params).ptr.field_1.value.reader.pointer = (__return_storage_ptr__->reader).pointer;
      *(int *)((long)&(this->params).ptr.field_1 + 0x18) = iVar4;
      *(undefined4 *)((long)&(this->params).ptr.field_1 + 0x1c) = uVar5;
      (paVar1->value).reader.segment = pSVar2;
      (this->params).ptr.field_1.value.reader.capTable = pCVar3;
      (this->params).ptr.isSet = true;
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x100,FAILED,"!releasedParams","_kjCondition,",&local_51);
  kj::_::Debug::Fault::fatal(&local_50);
}

Assistant:

AnyPointer::Reader getParams() override {
    KJ_REQUIRE(!releasedParams);
    KJ_IF_SOME(p, params) {
      return p;
    } else {
      auto result = paramsCapTable.imbue(inner->getParams());
      params = result;
      return result;
    }